

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

long __thiscall docopt::value::asLong(value *this)

{
  long lVar1;
  runtime_error *this_00;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->kind_ == String) {
    lVar1 = std::__cxx11::stol(&(this->variant_).strValue,&pos,10);
    if (pos != (this->variant_).strValue._M_string_length) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,&(this->variant_).strValue," contains non-numeric characters.");
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    throwIfNotKind(this,Long);
    lVar1 = (this->variant_).longValue;
  }
  return lVar1;
}

Assistant:

inline
	long value::asLong() const
	{
		// Attempt to convert a string to a long
		if (kind_ == Kind::String) {
			const std::string& str = variant_.strValue;
			std::size_t pos;
			const long ret = stol(str, &pos); // Throws if it can't convert
			if (pos != str.length()) {
				// The string ended in non-digits.
				throw std::runtime_error( str + " contains non-numeric characters.");
			}
			return ret;
		}
		throwIfNotKind(Kind::Long);
		return variant_.longValue;
	}